

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall Poisson::prepareNextState(Poisson *this)

{
  double dVar1;
  Poisson *this_local;
  
  if (((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
       stochNextStateIsPrepared & 1U) == 0) {
    dVar1 = RandN::dRandE((RandN *)this);
    if (this->poissonRate <= dVar1) {
      (this->super_StochasticEventGenerator).eventNextValue = false;
    }
    else {
      (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
      stochNextValue =
           (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
           stochNextValue + 1.0;
      (this->super_StochasticEventGenerator).eventNextValue = true;
    }
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextStateIsPrepared = true;
  }
  return;
}

Assistant:

void Poisson::prepareNextState()
{
	if (!stochNextStateIsPrepared) {
		if( dRandE() < poissonRate ) {
			stochNextValue += 1.0;
            eventNextValue = true;
        }
        else
            eventNextValue = false;
		stochNextStateIsPrepared = true;
	}
}